

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O3

void __thiscall
icu_63::DateTimePatternGenerator::DateTimePatternGenerator
          (DateTimePatternGenerator *this,DateTimePatternGenerator *other)

{
  char *pcVar1;
  PtnSkeleton *pPVar2;
  long lVar3;
  FormatParser *pFVar4;
  DateTimeMatcher *pDVar5;
  DistanceInfo *pDVar6;
  PatternMap *pPVar7;
  DateTimePatternGenerator *size;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DateTimePatternGenerator_00479730;
  size = other;
  Locale::Locale(&this->pLocale);
  lVar3 = 0x110;
  do {
    *(undefined ***)((this->pLocale).language + lVar3 + -0x18) = &PTR__UnicodeString_00487e70;
    pcVar1 = (this->pLocale).language + lVar3 + -0x10;
    pcVar1[0] = '\x02';
    pcVar1[1] = '\0';
    lVar3 = lVar3 + 0x40;
  } while (lVar3 != 0x510);
  lVar3 = 0x510;
  do {
    *(undefined ***)((this->pLocale).language + lVar3 + -0x18) = &PTR__UnicodeString_00487e70;
    pcVar1 = (this->pLocale).language + lVar3 + -0x10;
    pcVar1[0] = '\x02';
    pcVar1[1] = '\0';
    lVar3 = lVar3 + 0x40;
  } while (lVar3 != 0x1110);
  (this->dateTimeFormat).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00487e70;
  (this->dateTimeFormat).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->decimal).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00487e70;
  (this->decimal).fUnion.fStackFields.fLengthAndFlags = 2;
  this->skipMatcher = (DateTimeMatcher *)0x0;
  this->fAvailableFormatKeyHash = (Hashtable *)0x0;
  (this->emptyString).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00487e70;
  (this->emptyString).fUnion.fStackFields.fLengthAndFlags = 2;
  this->internalErrorCode = U_ZERO_ERROR;
  pFVar4 = (FormatParser *)UMemory::operator_new((UMemory *)0xc90,(size_t)size);
  if (pFVar4 != (FormatParser *)0x0) {
    pFVar4->_vptr_FormatParser = (_func_int **)&PTR__FormatParser_00479850;
    lVar3 = 0x10;
    do {
      *(undefined ***)((long)pFVar4 + lVar3 + -8) = &PTR__UnicodeString_00487e70;
      *(undefined2 *)((long)&pFVar4->_vptr_FormatParser + lVar3) = 2;
      lVar3 = lVar3 + 0x40;
    } while (lVar3 != 0xc90);
    pFVar4->itemNumber = 0;
    pFVar4->status = START;
  }
  this->fp = pFVar4;
  pDVar5 = (DateTimeMatcher *)UMemory::operator_new((UMemory *)0x98,(size_t)size);
  if (pDVar5 != (DateTimeMatcher *)0x0) {
    pDVar5->_vptr_DateTimeMatcher = (_func_int **)&PTR__DateTimeMatcher_00479830;
    (pDVar5->skeleton)._vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_00479898;
    (pDVar5->skeleton).original.chars[0] = '\0';
    (pDVar5->skeleton).original.chars[1] = '\0';
    (pDVar5->skeleton).original.chars[2] = '\0';
    (pDVar5->skeleton).original.chars[3] = '\0';
    (pDVar5->skeleton).original.chars[4] = '\0';
    (pDVar5->skeleton).original.chars[5] = '\0';
    (pDVar5->skeleton).original.chars[6] = '\0';
    (pDVar5->skeleton).original.chars[7] = '\0';
    pPVar2 = &pDVar5->skeleton;
    (pPVar2->original).chars[8] = '\0';
    (pPVar2->original).chars[9] = '\0';
    (pPVar2->original).chars[10] = '\0';
    (pPVar2->original).chars[0xb] = '\0';
    (pPVar2->original).chars[0xc] = '\0';
    (pPVar2->original).chars[0xd] = '\0';
    (pPVar2->original).chars[0xe] = '\0';
    (pPVar2->original).chars[0xf] = '\0';
    (pDVar5->skeleton).original.lengths[0] = '\0';
    (pDVar5->skeleton).original.lengths[1] = '\0';
    (pDVar5->skeleton).original.lengths[2] = '\0';
    (pDVar5->skeleton).original.lengths[3] = '\0';
    (pDVar5->skeleton).original.lengths[4] = '\0';
    (pDVar5->skeleton).original.lengths[5] = '\0';
    (pDVar5->skeleton).original.lengths[6] = '\0';
    (pDVar5->skeleton).original.lengths[7] = '\0';
    pPVar2 = &pDVar5->skeleton;
    (pPVar2->original).lengths[8] = '\0';
    (pPVar2->original).lengths[9] = '\0';
    (pPVar2->original).lengths[10] = '\0';
    (pPVar2->original).lengths[0xb] = '\0';
    (pPVar2->original).lengths[0xc] = '\0';
    (pPVar2->original).lengths[0xd] = '\0';
    (pPVar2->original).lengths[0xe] = '\0';
    (pPVar2->original).lengths[0xf] = '\0';
    (pDVar5->skeleton).baseOriginal.chars[0] = '\0';
    (pDVar5->skeleton).baseOriginal.chars[1] = '\0';
    (pDVar5->skeleton).baseOriginal.chars[2] = '\0';
    (pDVar5->skeleton).baseOriginal.chars[3] = '\0';
    (pDVar5->skeleton).baseOriginal.chars[4] = '\0';
    (pDVar5->skeleton).baseOriginal.chars[5] = '\0';
    (pDVar5->skeleton).baseOriginal.chars[6] = '\0';
    (pDVar5->skeleton).baseOriginal.chars[7] = '\0';
    pPVar2 = &pDVar5->skeleton;
    (pPVar2->baseOriginal).chars[8] = '\0';
    (pPVar2->baseOriginal).chars[9] = '\0';
    (pPVar2->baseOriginal).chars[10] = '\0';
    (pPVar2->baseOriginal).chars[0xb] = '\0';
    (pPVar2->baseOriginal).chars[0xc] = '\0';
    (pPVar2->baseOriginal).chars[0xd] = '\0';
    (pPVar2->baseOriginal).chars[0xe] = '\0';
    (pPVar2->baseOriginal).chars[0xf] = '\0';
    (pDVar5->skeleton).baseOriginal.lengths[0] = '\0';
    (pDVar5->skeleton).baseOriginal.lengths[1] = '\0';
    (pDVar5->skeleton).baseOriginal.lengths[2] = '\0';
    (pDVar5->skeleton).baseOriginal.lengths[3] = '\0';
    (pDVar5->skeleton).baseOriginal.lengths[4] = '\0';
    (pDVar5->skeleton).baseOriginal.lengths[5] = '\0';
    (pDVar5->skeleton).baseOriginal.lengths[6] = '\0';
    (pDVar5->skeleton).baseOriginal.lengths[7] = '\0';
    pPVar2 = &pDVar5->skeleton;
    (pPVar2->baseOriginal).lengths[8] = '\0';
    (pPVar2->baseOriginal).lengths[9] = '\0';
    (pPVar2->baseOriginal).lengths[10] = '\0';
    (pPVar2->baseOriginal).lengths[0xb] = '\0';
    (pPVar2->baseOriginal).lengths[0xc] = '\0';
    (pPVar2->baseOriginal).lengths[0xd] = '\0';
    (pPVar2->baseOriginal).lengths[0xe] = '\0';
    (pPVar2->baseOriginal).lengths[0xf] = '\0';
  }
  this->dtMatcher = pDVar5;
  pDVar6 = (DistanceInfo *)UMemory::operator_new((UMemory *)0x10,(size_t)size);
  if (pDVar6 != (DistanceInfo *)0x0) {
    pDVar6->_vptr_DistanceInfo = (_func_int **)&PTR__DistanceInfo_004799a8;
  }
  this->distanceInfo = pDVar6;
  pPVar7 = (PatternMap *)UMemory::operator_new((UMemory *)0x1b0,(size_t)size);
  if (pPVar7 != (PatternMap *)0x0) {
    pPVar7->_vptr_PatternMap = (_func_int **)&PTR__PatternMap_00479810;
    memset(pPVar7->boot,0,0x1a0);
    pPVar7->isDupAllowed = '\x01';
  }
  this->patternMap = pPVar7;
  if ((((pPVar7 == (PatternMap *)0x0) || (this->fp == (FormatParser *)0x0)) ||
      (this->dtMatcher == (DateTimeMatcher *)0x0)) || (this->distanceInfo == (DistanceInfo *)0x0)) {
    this->internalErrorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  operator=(this,other);
  return;
}

Assistant:

DateTimePatternGenerator::DateTimePatternGenerator(const DateTimePatternGenerator& other) :
    UObject(),
    skipMatcher(nullptr),
    fAvailableFormatKeyHash(nullptr),
    internalErrorCode(U_ZERO_ERROR)
{
    fp = new FormatParser();
    dtMatcher = new DateTimeMatcher();
    distanceInfo = new DistanceInfo();
    patternMap = new PatternMap();
    if (fp == nullptr || dtMatcher == nullptr || distanceInfo == nullptr || patternMap == nullptr) {
        internalErrorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    *this=other;
}